

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O3

UINT8 device_start_es5503(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DATA DVar2;
  void *pvVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ES5503Chip *chip;
  
  DVar2.chipInf = calloc(1,0x358);
  if ((DEV_DATA *)DVar2.chipInf == (DEV_DATA *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = 0x20000;
    pvVar3 = malloc(0x20000);
    ((DEV_DATA *)((long)DVar2.chipInf + 0x10))->chipInf = pvVar3;
    uVar7 = cfg->clock;
    *(uint *)((long)DVar2.chipInf + 0x33c) = uVar7;
    bVar5 = cfg->flags + (cfg->flags == '\0');
    *(byte *)&((DEV_DATA *)((long)DVar2.chipInf + 0x340))->chipInf = bVar5;
    uVar6 = bVar5 - 1;
    uVar6 = uVar6 >> 1 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    *(byte *)((long)DVar2.chipInf + 0x341) = (byte)(uVar6 >> 4) | (byte)uVar6;
    *(undefined1 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x338))->chipInf = 1;
    uVar7 = uVar7 / 0x18;
    *(uint *)((long)DVar2.chipInf + 0x344) = uVar7;
    lVar4 = 0x4d;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x34d);
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar7;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_es5503(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ES5503Chip *chip;

	chip = (ES5503Chip *)calloc(1, sizeof(ES5503Chip));
	if (chip == NULL)
		return 0xFF;
	
	chip->irq_func = NULL;
	chip->irq_param = NULL;
	chip->adc_func = NULL;
	chip->adc_param = NULL;
	
	chip->dramsize = 0x20000;	// 128 KB
	chip->docram = (UINT8*)malloc(chip->dramsize);
	chip->clock = cfg->clock;

	chip->output_channels = cfg->flags;
	if (! chip->output_channels)
		chip->output_channels = 1;
	chip->outchn_mask = (UINT8)pow2_mask(chip->output_channels);

	chip->oscsenabled = 1;
	chip->output_rate = (chip->clock/8)/(2+chip->oscsenabled);  // (input clock / 8) / # of oscs. enabled + 2
	
	es5503_set_mute_mask(chip, 0x00000000);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->output_rate, &devDef);
	
	return 0x00;
}